

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChObjFileShape.cpp
# Opt level: O2

void __thiscall chrono::ChObjFileShape::ArchiveOUT(ChObjFileShape *this,ChArchiveOut *marchive)

{
  ChNameValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  
  ChArchiveOut::VersionWrite<chrono::ChObjFileShape>(marchive);
  ChVisualShape::ArchiveOUT(&this->super_ChVisualShape,marchive);
  local_28._value = &this->filename;
  local_28._name = "filename";
  local_28._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_28);
  return;
}

Assistant:

void ChObjFileShape::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChObjFileShape>();
    // serialize parent class
    ChVisualShape::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(filename);
}